

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

void __thiscall
tchecker::clock_reset_t::clock_reset_t
          (clock_reset_t *this,clock_id_t left_id,clock_id_t right_id,integer_t value)

{
  invalid_argument *this_00;
  
  this->_left_id = left_id;
  this->_right_id = right_id;
  this->_value = value;
  if (left_id == 0x7fffffff) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"reference clock is not a left-value clock");
  }
  else {
    if (-1 < value) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"reset value should be >= 0");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

clock_reset_t::clock_reset_t(tchecker::clock_id_t left_id, tchecker::clock_id_t right_id, tchecker::integer_t value)
    : _left_id(left_id), _right_id(right_id), _value(value)
{
  if (_left_id == tchecker::REFCLOCK_ID)
    throw std::invalid_argument("reference clock is not a left-value clock");

  if (_value < 0)
    throw std::invalid_argument("reset value should be >= 0");
}